

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,uint16_t port,unsigned_short *eDI,Context *context)

{
  bool bVar1;
  unsigned_short uVar2;
  Writeable<unsigned_short> local_30;
  Context *local_28;
  Context *context_local;
  unsigned_short *eDI_local;
  unsigned_short *puStack_10;
  uint16_t port_local;
  unsigned_short *eCX_local;
  
  local_28 = context;
  context_local = (Context *)eDI;
  eDI_local._6_2_ = port;
  puStack_10 = eCX;
  bVar1 = repetition_over<unsigned_short,(InstructionSet::x86::Repetition)0>(eCX);
  if (!bVar1) {
    uVar2 = PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
            in<unsigned_short>(&local_28->io,eDI_local._6_2_);
    local_30.target_ =
         (unsigned_short *)
         PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)1>
                   (&local_28->memory,ES,(uint16_t)(context_local->flags).carry_);
    Writeable<unsigned_short>::operator=(&local_30,uVar2);
    uVar2 = Flags::direction<unsigned_short>(&local_28->flags);
    *(unsigned_short *)&(context_local->flags).carry_ =
         (short)(context_local->flags).carry_ + uVar2 * 2;
    repeat<unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puStack_10,local_28);
  }
  return;
}

Assistant:

void ins(
	AddressT &eCX,
	uint16_t port,
	AddressT &eDI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.memory.template access<IntT, AccessType::Write>(Source::ES, eDI) = context.io.template in<IntT>(port);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}